

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

ActivationSigmoidHard * __thiscall
CoreML::Specification::ActivationParams::mutable_sigmoidhard(ActivationParams *this)

{
  bool bVar1;
  ActivationSigmoidHard *this_00;
  ActivationParams *this_local;
  
  bVar1 = has_sigmoidhard(this);
  if (!bVar1) {
    clear_NonlinearityType(this);
    set_has_sigmoidhard(this);
    this_00 = (ActivationSigmoidHard *)operator_new(0x20);
    ActivationSigmoidHard::ActivationSigmoidHard(this_00);
    (this->NonlinearityType_).sigmoidhard_ = this_00;
  }
  return (ActivationSigmoidHard *)(this->NonlinearityType_).linear_;
}

Assistant:

inline ::CoreML::Specification::ActivationSigmoidHard* ActivationParams::mutable_sigmoidhard() {
  if (!has_sigmoidhard()) {
    clear_NonlinearityType();
    set_has_sigmoidhard();
    NonlinearityType_.sigmoidhard_ = new ::CoreML::Specification::ActivationSigmoidHard;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.ActivationParams.sigmoidHard)
  return NonlinearityType_.sigmoidhard_;
}